

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_dirhie.c
# Opt level: O3

CURLcode create_dir_hierarchy(char *outfile,GlobalConfig *global)

{
  CURLcode CVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  int *piVar6;
  CURLcode CVar7;
  char *fmt;
  size_t len;
  dynbuf dirbuf;
  dynbuf local_50;
  
  sVar3 = strlen(outfile);
  curlx_dyn_init(&local_50,sVar3 + 1);
  CVar7 = CURLE_OK;
  if (*outfile != '\0') {
    do {
      sVar3 = strspn(outfile,"/");
      sVar4 = strcspn(outfile + sVar3,"/");
      len = sVar4 + sVar3;
      CVar7 = CURLE_OK;
      if (outfile[len] == '\0') break;
      CVar1 = curlx_dyn_addn(&local_50,outfile,len);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
      pcVar5 = curlx_dyn_ptr(&local_50);
      iVar2 = mkdir(pcVar5,0x1e8);
      if (iVar2 == -1) {
        piVar6 = __errno_location();
        if ((*piVar6 != 0xd) && (*piVar6 != 0x11)) {
          pcVar5 = curlx_dyn_ptr(&local_50);
          iVar2 = *piVar6;
          if (iVar2 < 0x1e) {
            if (iVar2 == 0xd) {
              fmt = "You do not have permission to create %s";
            }
            else if (iVar2 == 0x1c) {
              fmt = "No space left on the file system that will contain the directory %s";
            }
            else {
LAB_0010cea5:
              fmt = "Error creating directory %s";
            }
          }
          else if (iVar2 == 0x1e) {
            fmt = "%s resides on a read-only file system";
          }
          else if (iVar2 == 0x7a) {
            fmt = "Cannot create directory %s because you exceeded your quota";
          }
          else {
            if (iVar2 != 0x24) goto LAB_0010cea5;
            fmt = "The directory name %s is too long";
          }
          errorf(global,fmt,pcVar5);
          CVar7 = CURLE_WRITE_ERROR;
          break;
        }
      }
      outfile = outfile + len;
    } while (*outfile != '\0');
  }
  curlx_dyn_free(&local_50);
  return CVar7;
}

Assistant:

CURLcode create_dir_hierarchy(const char *outfile, struct GlobalConfig *global)
{
  CURLcode result = CURLE_OK;
  size_t outlen = strlen(outfile);
  struct curlx_dynbuf dirbuf;

  curlx_dyn_init(&dirbuf, outlen + 1);

  while(*outfile) {
    bool skip = FALSE;
    size_t seplen = strspn(outfile, PATH_DELIMITERS);
    size_t len = strcspn(&outfile[seplen], PATH_DELIMITERS);

    /* the last path component is the file and it ends with a null byte */
    if(!outfile[len + seplen])
      break;

#if defined(_WIN32) || defined(MSDOS)
    if(!curlx_dyn_len(&dirbuf)) {
      /* Skip creating a drive's current directory. It may seem as though that
         would harmlessly fail but it could be a corner case if X: did not
         exist, since we would be creating it erroneously. eg if outfile is
         X:\foo\bar\filename then do not mkdir X: This logic takes into
         account unsupported drives !:, 1:, etc. */
      if(len > 1 && (outfile[1]==':'))
        skip = TRUE;
    }
#endif
    /* insert the leading separators (possibly plural) plus the following
       directory name */
    result = curlx_dyn_addn(&dirbuf, outfile, seplen + len);
    if(result)
      return result;

    /* Create directory. Ignore access denied error to allow traversal. */
    /* !checksrc! disable ERRNOVAR 1 */
    if(!skip && (-1 == mkdir(curlx_dyn_ptr(&dirbuf), (mode_t)0000750)) &&
       (errno != EACCES) && (errno != EEXIST)) {
      show_dir_errno(global, curlx_dyn_ptr(&dirbuf));
      result = CURLE_WRITE_ERROR;
      break; /* get out of loop */
    }
    outfile += len + seplen;
  }

  curlx_dyn_free(&dirbuf);

  return result;
}